

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O1

bool free_memory(uint adr,int type)

{
  uint uVar1;
  MemoryNode *pMVar2;
  MemoryNode *pMVar3;
  MemoryNode *pMVar4;
  MemoryNode *pMVar5;
  bool bVar6;
  
  pMVar4 = code_used_memory_head;
  pMVar5 = code_free_memory_head;
  if ((type != 1) && (pMVar4 = data_used_memory_head, pMVar5 = data_free_memory_head, type != 0)) {
    pMVar4 = (MemoryNode *)0x0;
    pMVar5 = (MemoryNode *)0x0;
  }
  while( true ) {
    bVar6 = pMVar4 != (MemoryNode *)0x0;
    if (!bVar6) {
      return bVar6;
    }
    if (pMVar4->address == adr) break;
    pMVar4 = pMVar4->next;
  }
  uVar1 = pMVar4->size;
  pMVar3 = pMVar4->forward;
  pMVar2 = pMVar4->next;
  pMVar3->next = pMVar2;
  if (pMVar2 != (MemoryNode *)0x0) {
    pMVar2->forward = pMVar3;
  }
  operator_delete(pMVar4,0x20);
  pMVar4 = pMVar5->next;
  pMVar3 = (MemoryNode *)operator_new(0x20);
  pMVar3->address = adr;
  pMVar3->size = uVar1;
  pMVar3->forward = pMVar5;
  pMVar3->next = pMVar4;
  pMVar5->next = pMVar3;
  pMVar4->forward = pMVar3;
  return bVar6;
}

Assistant:

EXPORT bool free_memory(unsigned adr,int type) {
	MemoryNode *used_head=nullptr, *free_head = nullptr;
	init_get_head(type, free_head, used_head);
	MemoryNode * used = used_head;
	unsigned adr_size;
	while (used) //获取使用的链表
	{
		if (used->address == adr) break;
		else used = used->next;
	}
	if (!used) return false;
	else
	{
		adr_size = used->size;
		/*从使用链表中取下*/
		MemoryNode *forword = used->forward;
		MemoryNode *next = used->next;
		forword->next = used->next;
		if (next) next->forward = forword;
		delete(used);

		/*加入未使用的节点采用头插入*/

		MemoryNode *data_first = free_head->next;
		MemoryNode *new_free = new MemoryNode;
		new_free->address = adr;
		new_free->size = adr_size;
		new_free->forward = free_head;
		new_free->next = data_first;
		free_head->next = new_free;
		data_first->forward = new_free;

		return true;
	}
}